

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::hilbert_split
          (tetgenmesh *this,point *vertexarray,int arraysize,int gc0,int gc1,double bxmin,
          double bxmax,double bymin,double bymax,double bzmin,double bzmax)

{
  point pdVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  double dVar8;
  
  uVar3 = (gc1 ^ gc0) >> 1;
  if ((uint)(gc1 ^ gc0) < 2) {
    dVar8 = bxmin + bxmax;
  }
  else if (uVar3 == 1) {
    dVar8 = bymin + bymax;
  }
  else {
    dVar8 = bzmin + bzmax;
  }
  dVar8 = dVar8 * 0.5;
  uVar6 = (ulong)(arraysize - 1);
  if (((uint)gc0 >> (uVar3 & 0x1f) & 1) == 0) {
    iVar4 = 0;
    do {
      iVar5 = iVar4;
      if (iVar4 < arraysize) {
        lVar7 = 0;
        do {
          if (dVar8 <= vertexarray[iVar4 + lVar7][(int)uVar3]) {
            iVar5 = iVar4 + (int)lVar7;
            break;
          }
          lVar7 = lVar7 + 1;
          iVar5 = arraysize;
        } while ((long)arraysize - (long)iVar4 != lVar7);
      }
      if (-1 < (int)uVar6) {
        uVar6 = uVar6 & 0xffffffff;
        do {
          if (vertexarray[uVar6][(int)uVar3] <= dVar8 && dVar8 != vertexarray[uVar6][(int)uVar3])
          goto LAB_00124e26;
          bVar2 = 0 < (long)uVar6;
          uVar6 = uVar6 - 1;
        } while (bVar2);
        uVar6 = 0xffffffff;
      }
LAB_00124e26:
      iVar4 = (int)uVar6;
      if (iVar5 == iVar4 + 1) {
        return iVar5;
      }
      pdVar1 = vertexarray[iVar5];
      vertexarray[iVar5] = vertexarray[iVar4];
      vertexarray[iVar4] = pdVar1;
      iVar4 = iVar5;
    } while( true );
  }
  iVar4 = 0;
  do {
    iVar5 = iVar4;
    if (iVar4 < arraysize) {
      lVar7 = 0;
      do {
        if (vertexarray[iVar4 + lVar7][(int)uVar3] <= dVar8) {
          iVar5 = iVar4 + (int)lVar7;
          break;
        }
        lVar7 = lVar7 + 1;
        iVar5 = arraysize;
      } while ((long)arraysize - (long)iVar4 != lVar7);
    }
    iVar4 = iVar5;
    if (-1 < (int)uVar6) {
      uVar6 = uVar6 & 0xffffffff;
      do {
        if (dVar8 < vertexarray[uVar6][(int)uVar3]) goto LAB_00124da7;
        bVar2 = 0 < (long)uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar2);
      uVar6 = 0xffffffff;
    }
LAB_00124da7:
    iVar5 = (int)uVar6;
    if (iVar4 == iVar5 + 1) {
      return iVar4;
    }
    pdVar1 = vertexarray[iVar4];
    vertexarray[iVar4] = vertexarray[iVar5];
    vertexarray[iVar5] = pdVar1;
  } while( true );
}

Assistant:

int tetgenmesh::hilbert_split(point* vertexarray,int arraysize,int gc0,int gc1,
                              REAL bxmin, REAL bxmax, REAL bymin, REAL bymax, 
                              REAL bzmin, REAL bzmax)
{
  point swapvert;
  int axis, d;
  REAL split;
  int i, j;


  // Find the current splitting axis. 'axis' is a value 0, or 1, or 2, which 
  //   correspoding to x-, or y- or z-axis.
  axis = (gc0 ^ gc1) >> 1; 

  // Calulate the split position along the axis.
  if (axis == 0) {
    split = 0.5 * (bxmin + bxmax);
  } else if (axis == 1) {
    split = 0.5 * (bymin + bymax);
  } else { // == 2
    split = 0.5 * (bzmin + bzmax);
  }

  // Find the direction (+1 or -1) of the axis. If 'd' is +1, the direction
  //   of the axis is to the positive of the axis, otherwise, it is -1.
  d = ((gc0 & (1<<axis)) == 0) ? 1 : -1;


  // Partition the vertices into left- and right-arrays such that left points
  //   have Hilbert indices lower than the right points.
  i = 0;
  j = arraysize - 1;

  // Partition the vertices into left- and right-arrays.
  if (d > 0) {
    do {
      for (; i < arraysize; i++) {      
        if (vertexarray[i][axis] >= split) break;
      }
      for (; j >= 0; j--) {
        if (vertexarray[j][axis] < split) break;
      }
      // Is the partition finished?
      if (i == (j + 1)) break;
      // Swap i-th and j-th vertices.
      swapvert = vertexarray[i];
      vertexarray[i] = vertexarray[j];
      vertexarray[j] = swapvert;
      // Continue patitioning the array;
    } while (true);
  } else {
    do {
      for (; i < arraysize; i++) {      
        if (vertexarray[i][axis] <= split) break;
      }
      for (; j >= 0; j--) {
        if (vertexarray[j][axis] > split) break;
      }
      // Is the partition finished?
      if (i == (j + 1)) break;
      // Swap i-th and j-th vertices.
      swapvert = vertexarray[i];
      vertexarray[i] = vertexarray[j];
      vertexarray[j] = swapvert;
      // Continue patitioning the array;
    } while (true);
  }

  return i;
}